

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::bdecode_node::list_at(bdecode_node *__return_storage_ptr__,bdecode_node *this,int i)

{
  int local_30;
  int local_2c;
  int item;
  int token;
  bdecode_token *tokens;
  int i_local;
  bdecode_node *this_local;
  
  local_2c = this->m_token_idx + 1;
  local_30 = 0;
  if ((this->m_last_index <= i) && (this->m_last_index != -1)) {
    local_2c = this->m_last_token;
    local_30 = this->m_last_index;
  }
  for (; local_30 < i; local_30 = local_30 + 1) {
    local_2c = (SUB84(this->m_root_tokens[local_2c],4) & 0x1fffffff) + local_2c;
  }
  this->m_last_token = local_2c;
  this->m_last_index = i;
  bdecode_node(__return_storage_ptr__,this->m_root_tokens,this->m_buffer,this->m_buffer_size,
               local_2c);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode_node::list_at(int i) const
	{
		TORRENT_ASSERT(type() == list_t);
		TORRENT_ASSERT(i >= 0);

		// make sure this is a list.
		bdecode_token const* tokens = m_root_tokens;

		// this is the first item
		int token = m_token_idx + 1;
		int item = 0;

		// do we have a lookup cached?
		if (m_last_index <= i && m_last_index != -1)
		{
			token = m_last_token;
			item = m_last_index;
		}

		while (item < i)
		{
			token += tokens[token].next_item;
			++item;

			// index 'i' out of range
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);
		}

		m_last_token = token;
		m_last_index = i;

		return bdecode_node(tokens, m_buffer, m_buffer_size, token);
	}